

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

int __thiscall mpt::layout::line::convert(line *this,type_t type,void *ptr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  line local_38;
  
  iVar2 = type_properties<mpt::layout::line_*>::id(true);
  iVar3 = (int)type;
  if (iVar2 < 0) {
    iVar2 = 0x100;
  }
  else {
    local_38._0_8_ = this;
    bVar1 = assign<mpt::layout::line*>((line **)&local_38,iVar3,ptr);
    if (bVar1) {
      return iVar2;
    }
  }
  if (type == 0) {
    if (ptr == (void *)0x0) {
      return iVar2;
    }
    *(uint8_t **)ptr = convert::fmt;
    return iVar2;
  }
  if (ptr == (void *)0x0 || iVar3 != 0x100) {
    if (iVar3 != 0x100) {
      if (iVar3 == 0x84 && ptr != (void *)0x0) {
        this = (line *)&this->super_object;
        goto LAB_001394f5;
      }
      if (iVar3 != 0x84) {
        local_38._0_8_ = *(undefined8 *)&this->super_line;
        local_38.from.super_point<float> = (this->super_line).from.super_point<float>;
        local_38.to.super_point<float> = (this->super_line).to.super_point<float>;
        bVar1 = assign<mpt::line>(&local_38,iVar3,ptr);
        if (bVar1) {
          return 0x84;
        }
        local_38._0_8_ = &this->super_line;
        bVar1 = assign<mpt::color*>((color **)&local_38,iVar3,ptr);
        if (bVar1) {
          iVar3 = type_properties<mpt::lineattr>::id(true);
        }
        else {
          local_38._0_8_ = &(this->super_line).attr;
          bVar1 = assign<mpt::lineattr*>((lineattr **)&local_38,iVar3,ptr);
          if (!bVar1) {
            return -3;
          }
          iVar3 = type_properties<mpt::color>::id(true);
        }
        goto LAB_0013951c;
      }
    }
  }
  else {
LAB_001394f5:
    *(line **)ptr = this;
  }
  iVar3 = type_properties<mpt::line>::id(true);
LAB_0013951c:
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

int layout::line::convert(type_t type, void *ptr)
{
	int me = type_properties<line *>::id(true);
	if (me < 0) {
		me = TypeMetaPtr;
	}
	else if (assign(this, type, ptr)) {
		return me;
	}
	
	if (!type) {
		static const uint8_t fmt[] = {
			TypeObjectPtr,
			0
		};
		if (ptr) *static_cast<const uint8_t **>(ptr) = fmt;
		return me;
	}
	
	if (assign(static_cast<metatype *>(this), type, ptr)) {
		int li = type_properties<::mpt::line>::id(true);
		return li > 0 ? li : me;
	}
	if (assign(static_cast<object *>(this), type, ptr)) {
		int li = type_properties<::mpt::line>::id(true);
		return li > 0 ? li : me;
	}
	if (assign(static_cast< ::mpt::line>(*this), type, ptr)) {
		return TypeObjectPtr;
	}
	if (assign(&color, type, ptr)) {
		int la = type_properties<::mpt::lineattr>::id(true);
		return la > 0 ? la : me;
	}
	if (assign(&attr, type, ptr)) {
		int col = type_properties<::mpt::color>::id(true);
		return col > 0 ? col : me;
	}
	return BadType;
}